

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

int Curl_splayremovebyaddr(Curl_tree *t,Curl_tree *removenode,Curl_tree **newroot)

{
  Curl_tree *pCVar1;
  uint local_3c;
  uint local_38;
  uint local_34;
  Curl_tree *local_30;
  Curl_tree *x;
  Curl_tree **newroot_local;
  Curl_tree *removenode_local;
  Curl_tree *t_local;
  
  if ((t == (Curl_tree *)0x0) || (removenode == (Curl_tree *)0x0)) {
    t_local._4_4_ = 1;
  }
  else {
    if ((removenode->key).tv_sec < 0) {
      if ((removenode->key).tv_sec < -1) {
        local_38 = 1;
      }
      else {
        if ((removenode->key).tv_usec < 0) {
          local_3c = (uint)((removenode->key).tv_usec < -1);
        }
        else {
          local_3c = 0xffffffff;
        }
        local_38 = local_3c;
      }
      local_34 = local_38;
    }
    else {
      local_34 = 0xffffffff;
    }
    if (local_34 == 0) {
      if (removenode->samen == removenode) {
        t_local._4_4_ = 3;
      }
      else {
        removenode->samep->samen = removenode->samen;
        removenode->samen->samep = removenode->samep;
        removenode->samen = removenode;
        *newroot = t;
        t_local._4_4_ = 0;
      }
    }
    else {
      pCVar1 = Curl_splay(removenode->key,t);
      if (pCVar1 == removenode) {
        local_30 = pCVar1->samen;
        if (local_30 == pCVar1) {
          if (pCVar1->smaller == (Curl_tree *)0x0) {
            local_30 = pCVar1->larger;
          }
          else {
            local_30 = Curl_splay(removenode->key,pCVar1->smaller);
            local_30->larger = pCVar1->larger;
          }
        }
        else {
          (local_30->key).tv_sec = (pCVar1->key).tv_sec;
          (local_30->key).tv_usec = (pCVar1->key).tv_usec;
          local_30->larger = pCVar1->larger;
          local_30->smaller = pCVar1->smaller;
          local_30->samep = pCVar1->samep;
          pCVar1->samep->samen = local_30;
        }
        *newroot = local_30;
        t_local._4_4_ = 0;
      }
      else {
        t_local._4_4_ = 2;
      }
    }
  }
  return t_local._4_4_;
}

Assistant:

int Curl_splayremovebyaddr(struct Curl_tree *t,
                           struct Curl_tree *removenode,
                           struct Curl_tree **newroot)
{
  static const struct timeval KEY_NOTUSED = {-1, -1}; /* will *NEVER* appear */
  struct Curl_tree *x;

  if(!t || !removenode)
    return 1;

  if(compare(KEY_NOTUSED, removenode->key) == 0) {
    /* Key set to NOTUSED means it is a subnode within a 'same' linked list
       and thus we can unlink it easily. */
    if(removenode->samen == removenode)
      /* A non-subnode should never be set to KEY_NOTUSED */
      return 3;

    removenode->samep->samen = removenode->samen;
    removenode->samen->samep = removenode->samep;

    /* Ensures that double-remove gets caught. */
    removenode->samen = removenode;

    *newroot = t; /* return the same root */
    return 0;
  }

  t = Curl_splay(removenode->key, t);

  /* First make sure that we got the same root node as the one we want
     to remove, as otherwise we might be trying to remove a node that
     isn't actually in the tree.

     We cannot just compare the keys here as a double remove in quick
     succession of a node with key != KEY_NOTUSED && same != NULL
     could return the same key but a different node. */
  if(t != removenode)
    return 2;

  /* Check if there is a list with identical sizes, as then we're trying to
     remove the root node of a list of nodes with identical keys. */
  x = t->samen;
  if(x != t) {
    /* 'x' is the new root node, we just make it use the root node's
       smaller/larger links */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;
  }
  else {
    /* Remove the root node */
    if(t->smaller == NULL)
      x = t->larger;
    else {
      x = Curl_splay(removenode->key, t->smaller);
      x->larger = t->larger;
    }
  }

  *newroot = x; /* store new root pointer */

  return 0;
}